

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

void __thiscall QOpenGLTexture::setMipLevels(QOpenGLTexture *this,int levels)

{
  Target line;
  bool bVar1;
  QOpenGLTexturePrivate *this_00;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  QOpenGLTexturePrivate *d;
  char *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QOpenGLTexture *)0x18caee);
  QOpenGLTexturePrivate::create(this_00);
  bVar1 = isStorageAllocated((QOpenGLTexture *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88)
    ;
    QMessageLogger::warning
              (local_28,
               "Cannot set mip levels on a texture that already has storage allocated.\nTo do so, destroy() the texture and then create() and setMipLevels()"
              );
    goto LAB_0018cbf9;
  }
  line = this_00->target;
  if ((line - Target1D < 2) || (line == Target3D)) {
LAB_0018cbc5:
    this_00->requestedMipLevels = in_ESI;
  }
  else {
    if (line != TargetRectangle) {
      if (((line == TargetCubeMap) || (line == Target1DArray)) || (line == Target2DArray))
      goto LAB_0018cbc5;
      if (line != TargetBuffer) {
        if (line == TargetCubeMapArray) goto LAB_0018cbc5;
        if ((line != Target2DMultisample) && (line != Target2DMultisampleArray)) goto LAB_0018cbf9;
      }
    }
    QMessageLogger::QMessageLogger((QMessageLogger *)this_00,in_RDI,line,in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (local_48,
               "QAbstractOpenGLTexture::setMipLevels(): This texture target does not support mipmaps"
              );
  }
LAB_0018cbf9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGLTexture::setMipLevels(int levels)
{
    Q_D(QOpenGLTexture);
    d->create();
    if (isStorageAllocated()) {
        qWarning("Cannot set mip levels on a texture that already has storage allocated.\n"
                 "To do so, destroy() the texture and then create() and setMipLevels()");
        return;
    }

    switch (d->target) {
    case QOpenGLTexture::Target1D:
    case QOpenGLTexture::Target1DArray:
    case QOpenGLTexture::Target2D:
    case QOpenGLTexture::Target2DArray:
    case QOpenGLTexture::TargetCubeMap:
    case QOpenGLTexture::TargetCubeMapArray:
    case QOpenGLTexture::Target3D:
        d->requestedMipLevels = levels;
        break;

    case QOpenGLTexture::TargetBuffer:
    case QOpenGLTexture::TargetRectangle:
    case QOpenGLTexture::Target2DMultisample:
    case QOpenGLTexture::Target2DMultisampleArray:
        qWarning("QAbstractOpenGLTexture::setMipLevels(): This texture target does not support mipmaps");
        break;
    }
}